

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonRewrite.c
# Opt level: O2

_Bool ParseCommandLineBoolArg(int *pArgC,char ***pArgV,char *String1,char *String2)

{
  char *__s2;
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int i;
  ulong uVar7;
  
  uVar5 = *pArgC;
  uVar6 = 0;
  uVar7 = 0;
  _Var2 = false;
  do {
    if ((long)(int)uVar5 <= (long)uVar7) {
      return _Var2;
    }
    __s2 = (*pArgV)[uVar7];
    iVar3 = strcasecmp(String1,__s2);
    if (iVar3 == 0) {
LAB_001015d3:
      uVar5 = uVar5 - 1;
      uVar1 = uVar5;
      if ((int)uVar5 < (int)uVar6) {
        uVar1 = uVar6;
      }
      for (uVar4 = uVar7; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        (*pArgV)[uVar4] = (*pArgV)[uVar4 + 1];
      }
      *pArgC = uVar5;
      _Var2 = true;
    }
    else {
      iVar3 = strcasecmp(String2,__s2);
      if (iVar3 == 0) goto LAB_001015d3;
    }
    uVar7 = uVar7 + 1;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static
bool
    ParseCommandLineBoolArg
    (
        int*        pArgC,      // [in,out]
        char***     pArgV,      // [in,out]
        char const* String1,    // [in]
        char const* String2     // [in]
    )
{
    bool itemExists = false;

    for( int i=0; i<*pArgC; i++ )
    {
        if(     strcasecmp( String1, (*pArgV)[i] ) == 0
            ||  strcasecmp( String2, (*pArgV)[i] ) == 0 )
        {
            itemExists = true;
            // ripple down remaining items
            for( int x=i; x<(*pArgC)-1; x++ )
            {
                (*pArgV)[x] = (*pArgV)[x+1];
            }
            *pArgC -= 1;
        }
    }

    return itemExists;
}